

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpt.cpp
# Opt level: O0

void __thiscall
indigox::algorithm::TDVertScore::JoinPropagate
          (TDVertScore *this,shared_ptr<indigox::algorithm::TDVertScore> *a,
          shared_ptr<indigox::algorithm::TDVertScore> *b)

{
  _Rb_tree_const_iterator<unsigned_int> __first;
  _Rb_tree_const_iterator<unsigned_int> __first_00;
  bool bVar1;
  element_type *peVar2;
  size_type sVar3;
  size_type sVar4;
  reference puVar5;
  pointer ppVar6;
  long *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>,_bool>
  pVar7;
  pair<std::_Rb_tree_iterator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_bool>
  pVar8;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar9;
  iterator it;
  Score maxScore;
  Score maxScore_1;
  pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>
  *ms;
  iterator __end4_1;
  iterator __begin4_1;
  multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *__range4_1;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> minScores;
  pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  *bm;
  iterator __end3_1;
  iterator __begin3_1;
  map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
  *__range3_1;
  pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>
  *e_2;
  iterator __end2_1;
  iterator __begin2_1;
  ProperScoreMatrix *__range2_1;
  ForgetMask placeMask;
  Score s;
  pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>
  *b_maskScore;
  iterator __end5;
  iterator __begin5;
  mapped_type *__range5;
  pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>
  *a_maskScore;
  iterator __end4;
  iterator __begin4;
  multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *__range4;
  MaskScores tmpScores;
  pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  *a_bagmask;
  iterator __end3;
  iterator __begin3;
  map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
  *__range3;
  uint32_t e_1;
  pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>
  *be;
  iterator __end2;
  iterator __begin2;
  ProperScoreMatrix *__range2;
  pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>
  *ae;
  iterator __end1;
  iterator __begin1;
  ProperScoreMatrix *__range1;
  BagScores tmpBags;
  uint32_t e;
  VertMask notFMask;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffbf8;
  iterator in_stack_fffffffffffffc00;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffc08;
  iterator __position;
  _Rb_tree_const_iterator<unsigned_int> in_stack_fffffffffffffc10;
  undefined7 in_stack_fffffffffffffc18;
  undefined1 in_stack_fffffffffffffc1f;
  _Rb_tree_const_iterator<unsigned_int> in_stack_fffffffffffffc20;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffc40;
  iterator in_stack_fffffffffffffc48;
  _Self local_2e8;
  _Self local_2e0;
  _Base_ptr local_2d8;
  _Base_ptr local_2d0;
  _Base_ptr local_2c8;
  uint local_2bc;
  _Base_ptr local_2b8;
  undefined1 local_2b0;
  _Base_ptr local_2a8;
  _Base_ptr local_2a0;
  _Base_ptr local_298;
  uint local_28c;
  _Base_ptr local_288;
  undefined1 local_280;
  reference local_278;
  _Self local_270;
  _Self local_268;
  multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *local_260;
  _Rb_tree_node_base local_258;
  reference local_228;
  _Self local_220;
  _Self local_218;
  map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
  *local_210;
  reference local_208;
  _Self local_200;
  _Self local_1f8;
  long *local_1f0;
  _Base_ptr local_1e8;
  uint local_1bc;
  reference local_1b8;
  _Self local_1b0;
  _Self local_1a8;
  mapped_type *local_1a0;
  reference local_198;
  _Self local_190;
  _Self local_188;
  multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *local_180;
  _Self local_178;
  _Self local_170;
  _Base_ptr local_168;
  undefined1 local_160;
  _Self local_128;
  _Self local_120;
  reference local_118;
  _Self local_110;
  _Self local_108;
  map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
  *local_100;
  uint local_f4;
  reference local_f0;
  _Self local_e8;
  _Self local_e0;
  ProperScoreMatrix *local_d8;
  reference local_d0;
  _Self local_c8;
  _Self local_c0;
  ProperScoreMatrix *local_b8;
  _Base_ptr local_b0;
  undefined1 local_a8;
  uint local_6c;
  
  std::
  __shared_ptr_access<indigox::algorithm::TDVertScore,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<indigox::algorithm::TDVertScore,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x15b677);
  std::
  __shared_ptr_access<indigox::algorithm::TDVertScore,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<indigox::algorithm::TDVertScore,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x15b690);
  boost::operator|((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffc48._M_node,in_stack_fffffffffffffc40);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (in_stack_fffffffffffffc08,
             (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffc00._M_node);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x15b6dc);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffc00._M_node,in_stack_fffffffffffffbf8);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::flip
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffc10._M_node);
  for (local_6c = *(uint *)(in_RDI + 8); local_6c <= *(uint *)((long)in_RDI + 0x44);
      local_6c = local_6c + 1) {
    std::
    map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
    ::map((map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
           *)0x15b74b);
    pVar7 = std::
            map<unsigned_int,std::map<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>,std::less<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::map<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>,std::less<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>>>>>>
            ::
            emplace<unsigned_int&,std::map<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>,std::less<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>>>&>
                      ((map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
                        *)in_stack_fffffffffffffc10._M_node,(uint *)in_stack_fffffffffffffc08,
                       (map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                        *)in_stack_fffffffffffffc00._M_node);
    local_b0 = (_Base_ptr)pVar7.first._M_node;
    local_a8 = pVar7.second;
    std::
    map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
    ::~map((map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
            *)0x15b7a8);
  }
  peVar2 = std::
           __shared_ptr_access<indigox::algorithm::TDVertScore,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<indigox::algorithm::TDVertScore,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x15b830);
  local_b8 = &peVar2->score;
  local_c0._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
       ::begin((map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
                *)in_stack_fffffffffffffbf8);
  local_c8._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
       ::end((map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
              *)in_stack_fffffffffffffbf8);
  do {
    bVar1 = std::operator!=(&local_c0,&local_c8);
    if (!bVar1) {
      if (Options::AssignElectrons::FPT::MINIMUM_PROPAGATION_DEPTH != 0) {
        local_1f0 = in_RDI + 2;
        local_1f8._M_node =
             (_Base_ptr)
             std::
             map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
             ::begin((map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
                      *)in_stack_fffffffffffffbf8);
        local_200._M_node =
             (_Base_ptr)
             std::
             map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
             ::end((map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
                    *)in_stack_fffffffffffffbf8);
        while (bVar1 = std::operator!=(&local_1f8,&local_200), bVar1) {
          local_208 = std::
                      _Rb_tree_iterator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>
                      ::operator*((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>
                                   *)0x15bed8);
          local_210 = &local_208->second;
          local_218._M_node =
               (_Base_ptr)
               std::
               map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
               ::begin((map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                        *)in_stack_fffffffffffffbf8);
          local_220._M_node =
               (_Base_ptr)
               std::
               map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
               ::end((map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                      *)in_stack_fffffffffffffbf8);
          while (bVar1 = std::operator!=(&local_218,&local_220), bVar1) {
            local_228 = std::
                        _Rb_tree_iterator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
                        ::operator*((_Rb_tree_iterator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
                                     *)0x15bf49);
            std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
                      ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       0x15bf5e);
            local_260 = &local_228->second;
            local_268._M_node =
                 (_Base_ptr)
                 std::
                 multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                 ::begin((multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                          *)in_stack_fffffffffffffbf8);
            local_270._M_node =
                 (_Base_ptr)
                 std::
                 multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                 ::end((multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                        *)in_stack_fffffffffffffbf8);
            while (bVar1 = std::operator!=(&local_268,&local_270), bVar1) {
              local_278 = std::
                          _Rb_tree_iterator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          ::operator*((_Rb_tree_iterator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                       *)0x15bfc7);
              sVar4 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                      ::size((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)0x15bfdc);
              if (sVar4 < Options::AssignElectrons::FPT::MINIMUM_PROPAGATION_DEPTH) {
                pVar9 = std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>
                        ::emplace<unsigned_int_const&>
                                  ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                    *)in_stack_fffffffffffffc20._M_node,
                                   (uint *)CONCAT17(in_stack_fffffffffffffc1f,
                                                    in_stack_fffffffffffffc18));
                local_288 = (_Base_ptr)pVar9.first._M_node;
                local_280 = pVar9.second;
              }
              else {
                local_2a0 = (_Base_ptr)
                            std::
                            set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                            ::begin((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                     *)in_stack_fffffffffffffbf8);
                local_2a8 = (_Base_ptr)
                            std::
                            set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                            ::end((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                   *)in_stack_fffffffffffffbf8);
                __first._M_node._7_1_ = in_stack_fffffffffffffc1f;
                __first._M_node._0_7_ = in_stack_fffffffffffffc18;
                local_298 = (_Base_ptr)
                            std::max_element<std::_Rb_tree_const_iterator<unsigned_int>>
                                      (__first,in_stack_fffffffffffffc10);
                puVar5 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                                   ((_Rb_tree_const_iterator<unsigned_int> *)0x15c0af);
                local_28c = *puVar5;
                if (local_278->first < local_28c) {
                  pVar9 = std::
                          set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
                          emplace<unsigned_int_const&>
                                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                      *)in_stack_fffffffffffffc20._M_node,
                                     (uint *)CONCAT17(in_stack_fffffffffffffc1f,
                                                      in_stack_fffffffffffffc18));
                  in_stack_fffffffffffffc20 = pVar9.first._M_node;
                  in_stack_fffffffffffffc1f = pVar9.second;
                  local_2b8 = in_stack_fffffffffffffc20._M_node;
                  local_2b0 = in_stack_fffffffffffffc1f;
                }
                sVar4 = std::
                        set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                        size((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)0x15c110);
                if (Options::AssignElectrons::FPT::MINIMUM_PROPAGATION_DEPTH < sVar4) {
                  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                  erase((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *
                        )in_stack_fffffffffffffc00._M_node,
                        (key_type_conflict1 *)in_stack_fffffffffffffbf8);
                }
              }
              std::
              _Rb_tree_iterator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            *)in_stack_fffffffffffffc00._M_node);
            }
            __position._M_node = &local_258;
            local_2d0 = (_Base_ptr)
                        std::
                        set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                        begin((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                               *)in_stack_fffffffffffffbf8);
            local_2d8 = (_Base_ptr)
                        std::
                        set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                        end((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)in_stack_fffffffffffffbf8);
            __first_00._M_node._7_1_ = in_stack_fffffffffffffc1f;
            __first_00._M_node._0_7_ = in_stack_fffffffffffffc18;
            in_stack_fffffffffffffc10 =
                 std::max_element<std::_Rb_tree_const_iterator<unsigned_int>>
                           (__first_00,in_stack_fffffffffffffc10);
            local_2c8 = in_stack_fffffffffffffc10._M_node;
            puVar5 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                               ((_Rb_tree_const_iterator<unsigned_int> *)0x15c1af);
            local_2bc = *puVar5;
            local_2e0._M_node =
                 (_Base_ptr)
                 std::
                 multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                 ::begin((multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                          *)in_stack_fffffffffffffbf8);
            while( true ) {
              local_2e8._M_node =
                   (_Base_ptr)
                   std::
                   multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                   ::end((multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                          *)in_stack_fffffffffffffbf8);
              bVar1 = std::operator!=(&local_2e0,&local_2e8);
              if (!bVar1) break;
              ppVar6 = std::
                       _Rb_tree_iterator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                     *)0x15c212);
              if (local_2bc < ppVar6->first) {
                in_stack_fffffffffffffc00 =
                     std::
                     multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>
                     ::erase_abi_cxx11_(in_stack_fffffffffffffc00._M_node,__position);
                local_2e0._M_node = in_stack_fffffffffffffc00._M_node;
              }
              else {
                std::
                _Rb_tree_iterator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              *)in_stack_fffffffffffffc00._M_node);
              }
            }
            std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                      ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       0x15c28b);
            std::
            _Rb_tree_iterator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
            ::operator++((_Rb_tree_iterator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
                          *)in_stack_fffffffffffffc00._M_node);
          }
          std::
          _Rb_tree_iterator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>
          ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>
                        *)in_stack_fffffffffffffc00._M_node);
        }
      }
      std::
      __shared_ptr_access<indigox::algorithm::TDVertScore,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<indigox::algorithm::TDVertScore,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x15c2c0);
      std::
      map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
      ::clear((map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
               *)0x15c2cc);
      std::
      __shared_ptr_access<indigox::algorithm::TDVertScore,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<indigox::algorithm::TDVertScore,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x15c2d9);
      std::
      map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
      ::clear((map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
               *)0x15c2e5);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x15c2f2);
      return;
    }
    local_d0 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>
               ::operator*((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>
                            *)0x15b891);
    peVar2 = std::
             __shared_ptr_access<indigox::algorithm::TDVertScore,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<indigox::algorithm::TDVertScore,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x15b8a6);
    local_d8 = &peVar2->score;
    local_e0._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
         ::begin((map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
                  *)in_stack_fffffffffffffbf8);
    local_e8._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
         ::end((map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
                *)in_stack_fffffffffffffbf8);
    while (bVar1 = std::operator!=(&local_e0,&local_e8), bVar1) {
      local_f0 = std::
                 _Rb_tree_iterator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>
                 ::operator*((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>
                              *)0x15b907);
      local_f4 = local_d0->first + local_f0->first;
      if ((*(uint *)(in_RDI + 8) <= local_f4) && (local_f4 <= *(uint *)((long)in_RDI + 0x44))) {
        local_100 = &local_d0->second;
        local_108._M_node =
             (_Base_ptr)
             std::
             map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
             ::begin((map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                      *)in_stack_fffffffffffffbf8);
        local_110._M_node =
             (_Base_ptr)
             std::
             map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
             ::end((map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                    *)in_stack_fffffffffffffbf8);
        while (bVar1 = std::operator!=(&local_108,&local_110), bVar1) {
          local_118 = std::
                      _Rb_tree_iterator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
                      ::operator*((_Rb_tree_iterator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
                                   *)0x15b9c0);
          std::
          map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
          ::at((map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
                *)in_stack_fffffffffffffc20._M_node,
               (key_type_conflict1 *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
          local_120._M_node =
               (_Base_ptr)
               std::
               map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
               ::find((map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                       *)in_stack_fffffffffffffbf8,(key_type *)0x15ba00);
          std::
          map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
          ::at((map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
                *)in_stack_fffffffffffffc20._M_node,
               (key_type_conflict1 *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
          local_128._M_node =
               (_Base_ptr)
               std::
               map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
               ::end((map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                      *)in_stack_fffffffffffffbf8);
          bVar1 = std::operator==(&local_120,&local_128);
          if (bVar1) {
            std::
            multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
            ::multimap((multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                        *)0x15ba7d);
            std::
            map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
            ::at((map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
                  *)in_stack_fffffffffffffc20._M_node,
                 (key_type_conflict1 *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18)
                );
            pVar8 = std::
                    map<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>,std::less<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>>>
                    ::
                    emplace<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const&,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>&>
                              ((map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                                *)in_stack_fffffffffffffc10._M_node,in_stack_fffffffffffffc08,
                               (multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                *)in_stack_fffffffffffffc00._M_node);
            local_168 = (_Base_ptr)pVar8.first._M_node;
            local_160 = pVar8.second;
            std::
            multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
            ::~multimap((multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                         *)0x15baf9);
          }
          local_170._M_node =
               (_Base_ptr)
               std::
               map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
               ::find((map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                       *)in_stack_fffffffffffffbf8,(key_type *)0x15bb3a);
          local_178._M_node =
               (_Base_ptr)
               std::
               map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
               ::end((map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                      *)in_stack_fffffffffffffbf8);
          bVar1 = std::operator==(&local_170,&local_178);
          if (!bVar1) {
            local_180 = &local_118->second;
            local_188._M_node =
                 (_Base_ptr)
                 std::
                 multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                 ::begin((multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                          *)in_stack_fffffffffffffbf8);
            local_190._M_node =
                 (_Base_ptr)
                 std::
                 multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                 ::end((multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                        *)in_stack_fffffffffffffbf8);
            while (bVar1 = std::operator!=(&local_188,&local_190), bVar1) {
              local_198 = std::
                          _Rb_tree_iterator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          ::operator*((_Rb_tree_iterator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                       *)0x15bbf6);
              local_1a0 = std::
                          map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                          ::at((map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                                *)in_stack_fffffffffffffc20._M_node,
                               (key_type *)
                               CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
              local_1a8._M_node =
                   (_Base_ptr)
                   std::
                   multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                   ::begin((multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                            *)in_stack_fffffffffffffbf8);
              local_1b0._M_node =
                   (_Base_ptr)
                   std::
                   multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                   ::end((multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                          *)in_stack_fffffffffffffbf8);
              while (bVar1 = std::operator!=(&local_1a8,&local_1b0), bVar1) {
                local_1b8 = std::
                            _Rb_tree_iterator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            ::operator*((_Rb_tree_iterator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                         *)0x15bc86);
                local_1bc = local_198->first + local_1b8->first;
                if (local_1bc <= *(uint *)(*in_RDI + 0x5c)) {
                  boost::operator|((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   in_stack_fffffffffffffc48._M_node,in_stack_fffffffffffffc40);
                  if (Options::AssignElectrons::MAXIMUM_RESULT_COUNT == 0) {
LAB_0015bd61:
                    std::
                    map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
                    ::at((map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
                          *)in_stack_fffffffffffffc20._M_node,
                         (key_type_conflict1 *)
                         CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
                    std::
                    map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                    ::at((map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                          *)in_stack_fffffffffffffc20._M_node,
                         (key_type *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
                    in_stack_fffffffffffffc48 =
                         std::
                         multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>
                         ::
                         emplace<unsigned_int&,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>&>
                                   ((multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                     *)in_stack_fffffffffffffc08,
                                    &(in_stack_fffffffffffffc00._M_node)->_M_color,
                                    in_stack_fffffffffffffbf8);
                    local_1e8 = in_stack_fffffffffffffc48._M_node;
                  }
                  else {
                    std::
                    map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
                    ::at((map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
                          *)in_stack_fffffffffffffc20._M_node,
                         (key_type_conflict1 *)
                         CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
                    std::
                    map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                    ::at((map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                          *)in_stack_fffffffffffffc20._M_node,
                         (key_type *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
                    sVar3 = std::
                            multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                            ::count((multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                     *)in_stack_fffffffffffffc00._M_node,
                                    (key_type_conflict1 *)in_stack_fffffffffffffbf8);
                    if (sVar3 < Options::AssignElectrons::MAXIMUM_RESULT_COUNT) goto LAB_0015bd61;
                  }
                  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                  ~dynamic_bitset((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                  0x15bdfd);
                }
                std::
                _Rb_tree_iterator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              *)in_stack_fffffffffffffc00._M_node);
              }
              std::
              _Rb_tree_iterator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            *)in_stack_fffffffffffffc00._M_node);
            }
          }
          std::
          _Rb_tree_iterator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
          ::operator++((_Rb_tree_iterator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
                        *)in_stack_fffffffffffffc00._M_node);
        }
      }
      std::
      _Rb_tree_iterator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>
                    *)in_stack_fffffffffffffc00._M_node);
    }
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>
                  *)in_stack_fffffffffffffc00._M_node);
  } while( true );
}

Assistant:

void TDVertScore::JoinPropagate(std::shared_ptr<TDVertScore> a, std::shared_ptr<TDVertScore> b)
{
  fMask = a->fMask | b->fMask;
  VertMask notFMask = VertMask(fMask);
  notFMask.flip();
  for (uint32_t e = min_e; e <= max_e; ++e) {
    BagScores tmpBags;
    score.emplace(e, tmpBags);
  }
  
  for (auto& ae : a->score) {
    for (auto& be : b->score) {
      uint32_t e = ae.first + be.first;
      if (e < min_e || e > max_e) continue;
      for (auto& a_bagmask : ae.second) {
        if (score.at(e).find(a_bagmask.first) == score.at(e).end()) {
          MaskScores tmpScores;
          score.at(e).emplace(a_bagmask.first, tmpScores);
        }
        if (be.second.find(a_bagmask.first) == be.second.end()) continue;
//        std::cerr << "Join jobs @" << min_e << "-" << e << "-" << max_e << ": " << be.second.at(a_bagmask.first).size() * a_bagmask.second.size() << std::endl;
        for (auto& a_maskScore : a_bagmask.second) {
          for (auto& b_maskScore : be.second.at(a_bagmask.first)) {
            Score s = a_maskScore.first + b_maskScore.first;
            if (s > parent->upperLimit_) continue;
            ForgetMask placeMask = a_maskScore.second | b_maskScore.second;
            if (opt_::MAXIMUM_RESULT_COUNT == 0
                || score.at(e).at(a_bagmask.first).count(s) < opt_::MAXIMUM_RESULT_COUNT) {
              score.at(e).at(a_bagmask.first).emplace(s, placeMask);
            }
          }
        }
      }
    }
  }
  if (opt_::FPT::MINIMUM_PROPAGATION_DEPTH > 0) {
    for (auto& e : score) {
      for (auto& bm : e.second) {
        std::set<Score> minScores;
        for (auto& ms : bm.second) {
          if (minScores.size() < opt_::FPT::MINIMUM_PROPAGATION_DEPTH) {
            minScores.emplace(ms.first);
          } else {
            Score maxScore = *std::max_element(minScores.begin(), minScores.end());
            if (ms.first < maxScore) minScores.emplace(ms.first);
            if (minScores.size() > opt_::FPT::MINIMUM_PROPAGATION_DEPTH)
              minScores.erase(maxScore);
          }
        }
        Score maxScore = *std::max_element(minScores.begin(), minScores.end());
        for (auto it = bm.second.begin(); it != bm.second.end();) {
          if (it->first > maxScore) it = bm.second.erase(it);
          else ++it;
        }
      }
    }
  }
  
//  if (opt_::MAXIMUM_RESULT_COUNT > 0) {
//    uint32_t x = opt_::MAXIMUM_RESULT_COUNT;
//    for (auto& e : score) {
//      for (auto& bm : e.second) {
//        std::multiset<Score> seenScores;
//        for (auto it = bm.second.begin(); it != bm.second.end();) {
//          seenScores.emplace(it->second);
//          if (seenScores.count(it->second) > x) {
//            it = bm.second.erase(it);
//          } else {
//            ++it;
//          }
//        }
//      }
//    }
//  }
  
  a->score.clear();
  b->score.clear();
}